

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

void asm_snap_alloc1(ASMState *as,IRRef ref)

{
  IRIns *ir;
  uint8_t uVar1;
  IRIns *pIVar2;
  byte bVar3;
  Reg RVar4;
  uint uVar5;
  IRIns *pIVar6;
  long lVar7;
  short sVar8;
  IRIns *pIVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar11 = (ulong)ref;
  while( true ) {
    uVar5 = (uint)uVar11;
    if (uVar5 < 0x8000) {
      return;
    }
    ir = as->ir + uVar11;
    uVar1 = (ir->field_1).r;
    if (-1 < (char)uVar1) {
      return;
    }
    if (uVar1 == 0xfd) {
      return;
    }
    if ((ir->field_1).s != '\0') {
      return;
    }
    if (uVar1 != 0xfe) break;
    (ir->field_1).r = 0xfd;
    if ((ir->field_1).o != 'Q') {
      pIVar6 = as->ir + (as->snapref - 1);
      goto LAB_0013dcc4;
    }
    uVar11 = (ulong)(ir->field_0).op2;
  }
  if (((ir->field_1).o == 'U') && ((ir->field_0).op2 == 0x1d3)) {
    uVar10 = as->curins;
    bVar12 = uVar5 < uVar10;
    if (uVar5 < uVar10) {
      pIVar6 = as->ir + uVar10;
      do {
        if ((((pIVar6->field_0).op1 == uVar5) || ((pIVar6->field_0).op2 == uVar5)) &&
           (1 < (byte)((pIVar6->field_1).r + 3))) goto LAB_0013dc47;
        pIVar6 = pIVar6 + -1;
        bVar12 = ir < pIVar6;
      } while (ir < pIVar6);
    }
    asm_snap_alloc1(as,(uint)(ir->field_0).op1);
LAB_0013dc47:
    if (!bVar12) {
      return;
    }
  }
  bVar3 = ((ir->field_1).t.irt & 0x1f) - 0xd;
  uVar10 = 0xffef;
  if (bVar3 < 2) {
    uVar10 = 0xffff0000;
  }
  if ((as->freeset & uVar10) != 0) {
LAB_0013dc70:
    RVar4 = ra_allocref(as,uVar5,uVar10);
    if (((ir->field_1).t.irt & 0x40) == 0) {
      as->weakset = as->weakset | 1 << ((byte)RVar4 & 0x1f);
    }
    if (as->mclim <= as->mcp) {
      return;
    }
    asm_mclimit(as);
  }
  if (bVar3 < 2) {
    lVar7 = 0;
    do {
      sVar8 = (short)as->cost[lVar7 + 0x10];
      if (-1 < sVar8) break;
      bVar12 = lVar7 != 0xf;
      lVar7 = lVar7 + 1;
    } while (bVar12);
    if (-1 < sVar8) goto LAB_0013dc70;
  }
  ra_spill(as,ir);
  return;
LAB_0013dcc4:
  if (pIVar6 <= ir) {
    return;
  }
  if ((pIVar6->field_1).r == 0xfe) {
    if ((ulong)(pIVar6->field_1).s == 0xff) {
      uVar5 = (pIVar6->field_1).o - 0x47;
      if ((4 < uVar5) || (uVar5 == 2)) goto LAB_0013dd37;
      pIVar2 = as->ir;
      pIVar9 = pIVar2 + (pIVar6->field_0).op1;
      if (((pIVar9->field_1).o & 0xfe) == 0x38) {
        pIVar9 = pIVar2 + (pIVar9->field_0).op1;
      }
      bVar12 = pIVar2 + (pIVar9->field_0).op1 == ir;
    }
    else {
      bVar12 = pIVar6 == ir + (pIVar6->field_1).s;
    }
    if (bVar12) {
      asm_snap_alloc1(as,(uint)(pIVar6->field_0).op2);
    }
  }
LAB_0013dd37:
  pIVar6 = pIVar6 + -1;
  goto LAB_0013dcc4;
}

Assistant:

static void asm_snap_alloc1(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (!irref_isk(ref) && (!(ra_used(ir) || ir->r == RID_SUNK))) {
    if (ir->r == RID_SINK) {
      ir->r = RID_SUNK;
#if LJ_HASFFI
      if (ir->o == IR_CNEWI) {  /* Allocate CNEWI value. */
	asm_snap_alloc1(as, ir->op2);
	if (LJ_32 && (ir+1)->o == IR_HIOP)
	  asm_snap_alloc1(as, (ir+1)->op2);
      } else
#endif
      {  /* Allocate stored values for TNEW, TDUP and CNEW. */
	IRIns *irs;
	lua_assert(ir->o == IR_TNEW || ir->o == IR_TDUP || ir->o == IR_CNEW);
	for (irs = IR(as->snapref-1); irs > ir; irs--)
	  if (irs->r == RID_SINK && asm_sunk_store(as, ir, irs)) {
	    lua_assert(irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
		       irs->o == IR_FSTORE || irs->o == IR_XSTORE);
	    asm_snap_alloc1(as, irs->op2);
	    if (LJ_32 && (irs+1)->o == IR_HIOP)
	      asm_snap_alloc1(as, (irs+1)->op2);
	  }
      }
    } else {
      RegSet allow;
      if (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT) {
	IRIns *irc;
	for (irc = IR(as->curins); irc > ir; irc--)
	  if ((irc->op1 == ref || irc->op2 == ref) &&
	      !(irc->r == RID_SINK || irc->r == RID_SUNK))
	    goto nosink;  /* Don't sink conversion if result is used. */
	asm_snap_alloc1(as, ir->op1);
	return;
      }
    nosink:
      allow = (!LJ_SOFTFP && irt_isfp(ir->t)) ? RSET_FPR : RSET_GPR;
      if ((as->freeset & allow) ||
	       (allow == RSET_FPR && asm_snap_canremat(as))) {
	/* Get a weak register if we have a free one or can rematerialize. */
	Reg r = ra_allocref(as, ref, allow);  /* Allocate a register. */
	if (!irt_isphi(ir->t))
	  ra_weak(as, r);  /* But mark it as weakly referenced. */
	checkmclim(as);
	RA_DBGX((as, "snapreg   $f $r", ref, ir->r));
      } else {
	ra_spill(as, ir);  /* Otherwise force a spill slot. */
	RA_DBGX((as, "snapspill $f $s", ref, ir->s));
      }
    }
  }
}